

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::IncrementTimestampDefault(RTPSession *this)

{
  int iVar1;
  
  if (this->created == true) {
    iVar1 = RTPPacketBuilder::IncrementTimestampDefault(&this->packetbuilder);
    return iVar1;
  }
  return -0x3e;
}

Assistant:

int RTPSession::IncrementTimestampDefault()
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	
	BUILDER_LOCK
	status = packetbuilder.IncrementTimestampDefault();
	BUILDER_UNLOCK
	return status;
}